

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_bf16.h
# Opt level: O3

void ncnn::cast_fp32_to_bf16_sse_avx2(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  undefined1 (*pauVar17) [32];
  undefined1 (*pauVar18) [32];
  int iVar19;
  uint uVar20;
  undefined1 auVar21 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar22 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  
  iVar1 = bottom_blob->c;
  if (0 < (long)iVar1) {
    uVar13 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    lVar16 = 0;
    auVar9 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar10 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar21._8_8_ = 0x8000000000000000;
    auVar21._0_8_ = 0x8000000000000000;
    auVar21._16_8_ = 0x8000000000000000;
    auVar21._24_8_ = 0x8000000000000000;
    auVar6 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
    auVar22._8_8_ = 0x8000000000000000;
    auVar22._0_8_ = 0x8000000000000000;
    auVar4 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
    do {
      pauVar17 = (undefined1 (*) [32])
                 (bottom_blob->cstep * lVar16 * bottom_blob->elemsize + (long)bottom_blob->data);
      pauVar18 = (undefined1 (*) [32])
                 (top_blob->cstep * lVar16 * top_blob->elemsize + (long)top_blob->data);
      if ((int)uVar13 < 0x10) {
        uVar14 = 0;
      }
      else {
        iVar19 = 0xf;
        do {
          auVar23 = vpsrld_avx2(*pauVar17,0x10);
          auVar24 = vpsrld_avx2(pauVar17[1],0x10);
          auVar23 = vpackusdw_avx2(auVar23,auVar24);
          auVar23 = vpermq_avx2(auVar23,0xd8);
          *pauVar18 = auVar23;
          pauVar17 = pauVar17 + 2;
          pauVar18 = pauVar18 + 1;
          iVar19 = iVar19 + 0x10;
          uVar14 = uVar13 & 0xfffffff0;
        } while (iVar19 < (int)uVar13);
      }
      uVar20 = uVar14 | 7;
      while ((int)uVar20 < (int)uVar13) {
        auVar23 = vpsrld_avx2(*pauVar17,0x10);
        auVar3 = vpackusdw_avx(auVar23._0_16_,auVar23._16_16_);
        *(undefined1 (*) [16])*pauVar18 = auVar3;
        pauVar17 = pauVar17 + 1;
        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
        uVar20 = uVar14 + 0xf;
        uVar14 = uVar14 + 8;
      }
      if ((int)uVar14 < (int)uVar13) {
        uVar14 = ~uVar14 + uVar13;
        auVar25._8_4_ = uVar14;
        auVar25._0_8_ = CONCAT44(0,uVar14);
        auVar25._12_4_ = 0;
        auVar23._16_4_ = uVar14;
        auVar23._0_16_ = auVar25;
        auVar23._20_4_ = 0;
        auVar23._24_4_ = uVar14;
        auVar23._28_4_ = 0;
        auVar23 = vpor_avx2(auVar23,auVar21);
        auVar3 = vpor_avx(auVar25,auVar22);
        auVar25 = vpor_avx(auVar25,auVar22);
        uVar15 = 0;
        do {
          auVar24._8_8_ = uVar15;
          auVar24._0_8_ = uVar15;
          auVar24._16_8_ = uVar15;
          auVar24._24_8_ = uVar15;
          auVar11 = vpor_avx2(auVar24,auVar9);
          auVar12 = vpor_avx2(auVar24,auVar10);
          auVar7 = vpcmpgtq_avx2(auVar12 ^ auVar21,auVar23);
          auVar8 = vpcmpgtq_avx2(auVar11 ^ auVar21,auVar23);
          auVar24 = vpackssdw_avx2(auVar8,auVar7);
          auVar2 = vpackssdw_avx(SUB3216(auVar24 ^ auVar6,0),SUB3216(auVar24 ^ auVar6,0x10));
          auVar5 = vpshufd_avx(auVar2,0xd8);
          auVar24 = vpmovzxwd_avx2(auVar5);
          auVar24 = vpslld_avx2(auVar24,0x1f);
          auVar24 = vpmaskmovd_avx2(auVar24,*(undefined1 (*) [32])(*pauVar17 + uVar15 * 4));
          if ((auVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)(*pauVar18 + uVar15 * 2) = auVar24._2_2_;
          }
          auVar2 = vpcmpgtq_avx(auVar11._0_16_ ^ auVar22,auVar3);
          auVar2 = vpackssdw_avx(auVar2,auVar2);
          auVar2 = vpackssdw_avx(auVar2 ^ auVar4,auVar2 ^ auVar4);
          if ((auVar2 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)(*pauVar18 + uVar15 * 2 + 2) = auVar24._6_2_;
          }
          auVar11 = vpackssdw_avx2(auVar8,auVar9);
          auVar2 = auVar11._16_16_ ^ auVar4;
          auVar2 = vpackssdw_avx(auVar2,auVar2);
          if ((auVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)(*pauVar18 + uVar15 * 2 + 4) = auVar24._10_2_;
          }
          auVar8 = vpackssdw_avx2(auVar8,auVar9);
          auVar2 = auVar8._16_16_ ^ auVar4;
          auVar2 = vpackssdw_avx(auVar2,auVar2);
          if ((auVar2 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)(*pauVar18 + uVar15 * 2 + 6) = auVar24._14_2_;
          }
          auVar2 = vpcmpgtq_avx(auVar12._0_16_ ^ auVar22,auVar25);
          auVar2 = vpackssdw_avx(auVar2,auVar2);
          auVar2 = vpackssdw_avx(auVar2 ^ auVar4,auVar2 ^ auVar4);
          if ((auVar2 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)(*pauVar18 + uVar15 * 2 + 8) = auVar24._18_2_;
          }
          auVar2 = vpcmpgtq_avx(auVar12._0_16_ ^ auVar22,auVar25);
          auVar2 = vpackssdw_avx(auVar2,auVar2);
          auVar2 = vpackssdw_avx(auVar2 ^ auVar4,auVar2 ^ auVar4);
          if ((auVar2 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)(*pauVar18 + uVar15 * 2 + 10) = auVar24._22_2_;
          }
          auVar8 = vpackssdw_avx2(auVar9,auVar7);
          auVar2 = auVar8._16_16_ ^ auVar4;
          auVar2 = vpackssdw_avx(auVar2,auVar2);
          if ((auVar2 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)(*pauVar18 + uVar15 * 2 + 0xc) = auVar24._26_2_;
          }
          auVar7 = vpshufhw_avx2(auVar7,0x84);
          auVar2 = auVar7._16_16_ ^ auVar4;
          auVar2 = vpackssdw_avx(auVar2,auVar2);
          if ((auVar2 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)(*pauVar18 + uVar15 * 2 + 0xe) = auVar24._30_2_;
          }
          uVar15 = uVar15 + 8;
        } while ((CONCAT44(0,uVar14) + 8 & 0xfffffffffffffff8) != uVar15);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != iVar1);
  }
  return;
}

Assistant:

static void cast_fp32_to_bf16_sse(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
#if NCNN_RUNTIME_CPU && NCNN_AVX512BF16 && __AVX512F__ && !__AVX512BF16__
    if (ncnn::cpu_support_x86_avx512_bf16())
    {
        cast_fp32_to_bf16_sse_avx512bf16(bottom_blob, top_blob, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        cast_fp32_to_bf16_sse_avx2(bottom_blob, top_blob, opt);
        return;
    }
#endif

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int d = bottom_blob.d;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    const int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);
        unsigned short* outptr = top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 31 < size; i += 32)
        {
            _mm512_storeu_si512((__m512i*)outptr, float2bfloat_avx512(_mm512_loadu_ps(ptr), _mm512_loadu_ps(ptr + 16)));
            ptr += 32;
            outptr += 32;
        }
#endif // __AVX512F__
        for (; i + 15 < size; i += 16)
        {
#if __AVX512F__
            _mm256_storeu_si256((__m256i*)outptr, float2bfloat_avx512(_mm512_loadu_ps(ptr)));
#else
            _mm256_storeu_si256((__m256i*)outptr, float2bfloat_avx(_mm256_loadu_ps(ptr), _mm256_loadu_ps(ptr + 8)));
#endif
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX__
        for (; i + 7 < size; i += 8)
        {
#if __AVX__
            _mm_store_si128((__m128i*)outptr, float2bfloat_avx(_mm256_loadu_ps(ptr)));
#else
            _mm_store_si128((__m128i*)outptr, float2bfloat_sse(_mm_loadu_ps(ptr), _mm_loadu_ps(ptr + 4)));
#endif
            ptr += 8;
            outptr += 8;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr++ = float32_to_bfloat16(*ptr++);
        }
    }
}